

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ViewportCallOrderCase::iterate
          (ViewportCallOrderCase *this)

{
  ostringstream *poVar1;
  int iVar2;
  RenderContext *context;
  ulong uVar3;
  float fVar4;
  int iVar5;
  undefined4 uVar6;
  deUint32 err;
  undefined4 extraout_var;
  RenderTarget *pRVar8;
  TestLog *pTVar9;
  PixelBufferAccess *dst;
  ConstPixelBufferAccess *access;
  Surface *surface;
  LogImageSet *access_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  void *__buf_02;
  void *__buf_03;
  int y;
  uint z;
  int x;
  bool bVar10;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  allocator<char> local_45e;
  allocator<char> local_45d;
  allocator<char> local_45c;
  allocator<char> local_45b;
  allocator<char> local_45a;
  allocator<char> local_459;
  float local_458;
  float fStack_454;
  int iStack_450;
  int iStack_44c;
  Surface errorMask;
  ConstPixelBufferAccess local_428;
  Surface resultSurface;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  float local_328;
  float fStack_324;
  LogImageSet local_310;
  IVec4 pixel;
  LogImage local_150;
  LogImage local_c0;
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar5 = pRVar8->m_width;
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = pRVar8->m_height;
  uVar6 = (**(code **)(lVar7 + 0x780))
                    ((((this->m_program).
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       .m_data.ptr)->m_program).m_program,"a_position");
  tcu::Surface::Surface(&resultSurface,iVar5,iVar2);
  (**(code **)(lVar7 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar7 + 0x188))(0x4000);
  poVar1 = (ostringstream *)(pixel.m_data + 2);
  uVar3 = (long)iVar5 / 2;
  local_458 = (float)uVar6;
  iVar5 = 2;
  while( true ) {
    if (iVar5 == 0) break;
    if ((iVar5 == 2 && this->m_callOrder == VIEWPORT_FIRST) ||
       (this->m_callOrder == BBOX_FIRST && iVar5 == 1)) {
      pixel.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "Setting viewport to cover the left half of the render target.\n");
      std::operator<<((ostream *)poVar1,"\t(0, 0, ");
      std::ostream::operator<<(poVar1,(int)uVar3);
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::operator<<(poVar1,iVar2);
      std::operator<<((ostream *)poVar1,")");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&pixel,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      (**(code **)(lVar7 + 0x1a00))(0,0,uVar3 & 0xffffffff,iVar2);
      iVar5 = iVar5 + -1;
    }
    else {
      pixel.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(pixel.m_data + 2));
      std::operator<<((ostream *)(pixel.m_data + 2),
                      "Setting bounding box to cover the right half of the clip space.\n");
      std::operator<<((ostream *)(pixel.m_data + 2),
                      "\t(0.0, -1.0, -1.0, 1.0) .. (1.0, 1.0, 1.0f, 1.0)");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&pixel,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(pixel.m_data + 2));
      (**(code **)(lVar7 + 0x1040))
                (0,0xbf800000,0xbf800000,0x3f800000,0x3f800000,0x3f800000,0x3f800000,0x3f800000);
      iVar5 = iVar5 + -1;
    }
  }
  pixel.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(pixel.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Rendering mesh covering the right half of the clip space.");
  fVar4 = local_458;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&pixel,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  (**(code **)(lVar7 + 0x40))
            (0x8892,(((this->m_vbo).
                      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                      .m_data.ptr)->super_ObjectWrapper).m_object);
  (**(code **)(lVar7 + 0x19f0))(fVar4,4,0x1406,0,0x10,0);
  (**(code **)(lVar7 + 0x610))(fVar4);
  (**(code **)(lVar7 + 0x1680))
            ((((this->m_program).
               super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.
              ptr)->m_program).m_program);
  (**(code **)(lVar7 + 0xfd8))(0x8e72,3);
  (**(code **)(lVar7 + 0x538))(0xe,0,this->m_numVertices);
  err = (**(code **)(lVar7 + 0x800))();
  glu::checkError(err,"post-draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0x128e);
  pixel.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(pixel.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Verifying image");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&pixel,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&pixel,&resultSurface);
  dst = (PixelBufferAccess *)&pixel;
  glu::readPixels(context,0,0,dst);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_428,&resultSurface);
  iVar2 = local_428.m_size.m_data[1];
  iVar5 = local_428.m_size.m_data[0];
  local_458 = (float)local_428.m_size.m_data[0] * 0.25;
  local_328 = ceilf(local_458);
  fStack_324 = extraout_XMM0_Db;
  local_458 = floorf(local_458);
  fStack_454 = extraout_XMM0_Db_00;
  tcu::Surface::Surface(&errorMask,iVar5,iVar2);
  tcu::Surface::getAccess((PixelBufferAccess *)&pixel,&errorMask);
  local_c0.m_name._M_dataplus._M_p._0_4_ = 0xff00ff00;
  tcu::RGBA::toIVec((RGBA *)&local_150);
  tcu::clear((PixelBufferAccess *)&pixel,(IVec4 *)&local_150);
  iStack_450 = (int)fStack_454;
  iStack_44c = (int)fStack_324;
  local_458 = (float)((int)local_458 + -1);
  fStack_454 = (float)((int)local_328 + 1);
  bVar10 = false;
  for (z = 0; (int)z < local_428.m_size.m_data[1]; z = z + 1) {
    for (iVar5 = 0; iVar5 < local_428.m_size.m_data[0]; iVar5 = iVar5 + 1) {
      dst = (PixelBufferAccess *)(ulong)z;
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)&pixel,(int)&local_428,iVar5,z);
      if ((((float)iVar5 == fStack_454) && ((pixel.m_data[1] != 0xff || (pixel.m_data[2] != 0)))) ||
         (((float)iVar5 == local_458 &&
          (((pixel.m_data[0] != 0 || (pixel.m_data[1] != 0)) || (pixel.m_data[2] != 0)))))) {
        *(undefined4 *)
         ((long)errorMask.m_pixels.m_ptr + (long)(int)(errorMask.m_width * z + iVar5) * 4) =
             0xff0000ff;
        bVar10 = true;
        dst = (PixelBufferAccess *)errorMask.m_pixels.m_ptr;
      }
    }
  }
  if (!bVar10) {
    tcu::Surface::~Surface(&errorMask);
    pixel.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(pixel.m_data + 2);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Result ok.");
    pTVar9 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&pixel,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_428,"Images",(allocator<char> *)&local_348);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,"Image verification",(allocator<char> *)&local_368);
    tcu::LogImageSet::LogImageSet((LogImageSet *)&local_c0,(string *)&local_428,&local_3a8);
    tcu::LogImageSet::write((LogImageSet *)&local_c0,(int)pTVar9,__buf_02,(size_t)dst);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c8,"Result",(allocator<char> *)&local_388);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,"Result",(allocator<char> *)&errorMask);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_310,&resultSurface);
    access_00 = &local_310;
    tcu::LogImage::LogImage
              (&local_150,&local_3c8,&local_3e8,(ConstPixelBufferAccess *)access_00,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_150,(int)pTVar9,__buf_03,(size_t)access_00);
    tcu::TestLog::endImageSet(pTVar9);
    tcu::LogImage::~LogImage(&local_150);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_3c8);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_c0);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    description = "Pass";
  }
  else {
    pixel.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(pixel.m_data + 2);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Image verification failed.");
    pTVar9 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&pixel,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"Images",&local_459);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c8,"Image verification",&local_45a);
    tcu::LogImageSet::LogImageSet(&local_310,&local_3a8,&local_3c8);
    iVar5 = (int)pTVar9;
    tcu::LogImageSet::write(&local_310,iVar5,__buf,(size_t)dst);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,"ResultImage",&local_45b);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"Result image",&local_45c);
    access = &local_428;
    tcu::LogImage::LogImage(&local_150,&local_3e8,&local_348,access,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_150,iVar5,__buf_00,(size_t)access);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"ErrorMask",&local_45d);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"Error mask",&local_45e)
    ;
    surface = &errorMask;
    tcu::LogImage::LogImage(&local_c0,&local_368,&local_388,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_c0,iVar5,__buf_01,(size_t)surface);
    tcu::TestLog::endImageSet(pTVar9);
    tcu::LogImage::~LogImage(&local_c0);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_368);
    tcu::LogImage::~LogImage(&local_150);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_3e8);
    tcu::LogImageSet::~LogImageSet(&local_310);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::Surface::~Surface(&errorMask);
    description = "Image verification failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar10,description
            );
  tcu::Surface::~Surface(&resultSurface);
  return STOP;
}

Assistant:

ViewportCallOrderCase::IterateResult ViewportCallOrderCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const tcu::IVec2		viewportSize	= tcu::IVec2(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight());
	const glw::GLint		posLocation		= gl.getAttribLocation(m_program->getProgram(), "a_position");
	tcu::Surface			resultSurface	(viewportSize.x(), viewportSize.y());

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	// set state
	for (int orderNdx = 0; orderNdx < 2; ++orderNdx)
	{
		if ((orderNdx == 0 && m_callOrder == VIEWPORT_FIRST) ||
			(orderNdx == 1 && m_callOrder == BBOX_FIRST))
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Setting viewport to cover the left half of the render target.\n"
				<< "\t(0, 0, " << (viewportSize.x()/2) << ", " << viewportSize.y() << ")"
				<< tcu::TestLog::EndMessage;

			gl.viewport(0, 0, viewportSize.x()/2, viewportSize.y());
		}
		else
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Setting bounding box to cover the right half of the clip space.\n"
				<< "\t(0.0, -1.0, -1.0, 1.0) .. (1.0, 1.0, 1.0f, 1.0)"
				<< tcu::TestLog::EndMessage;

			gl.primitiveBoundingBox(0.0f, -1.0f, -1.0f, 1.0f,
									1.0f,  1.0f,  1.0f, 1.0f);
		}
	}

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Rendering mesh covering the right half of the clip space."
		<< tcu::TestLog::EndMessage;

	gl.bindBuffer(GL_ARRAY_BUFFER, **m_vbo);
	gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, sizeof(float[4]), (const float*)DE_NULL);
	gl.enableVertexAttribArray(posLocation);
	gl.useProgram(m_program->getProgram());
	gl.patchParameteri(GL_PATCH_VERTICES, 3);
	gl.drawArrays(GL_PATCHES, 0, m_numVertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "post-draw");

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying image"
		<< tcu::TestLog::EndMessage;
	glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());

	if (!verifyImage(resultSurface.getAccess()))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Result ok."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Result", "Result", resultSurface.getAccess())
			<< tcu::TestLog::EndImageSet;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	return STOP;
}